

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.h
# Opt level: O0

void __thiscall libchars::edit_object::wipe(edit_object *this)

{
  char *local_18;
  char *p;
  edit_object *this_local;
  
  if (this->insert_idx < this->buflen) {
    local_18 = this->buffer + (this->buflen - 1);
    while (this->insert_idx < this->buflen) {
      *local_18 = '\0';
      this->buflen = this->buflen - 1;
      local_18 = local_18 + -1;
    }
    if (this->buflen == 0) {
      (*this->_vptr_edit_object[2])();
    }
  }
  return;
}

Assistant:

virtual void wipe()
        {
            if (buflen > insert_idx) {
                volatile char *p = buffer + buflen - 1;
                while (buflen > insert_idx) {
                    *p-- = 0;
                    --buflen;
                }
                if (buflen == 0)
                    emptied();
            }
        }